

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O2

void zswap(int n,complex<double> *cx,int incx,complex<double> *cy,int incy)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  complex<double> *pcVar4;
  long lVar5;
  complex<double> *pcVar6;
  bool bVar7;
  
  if (0 < n) {
    if (incy == 1 && incx == 1) {
      for (lVar5 = 0; (ulong)(uint)n << 4 != lVar5; lVar5 = lVar5 + 0x10) {
        uVar1 = *(undefined8 *)(cx->_M_value + lVar5);
        uVar2 = *(undefined8 *)((long)(cx->_M_value + lVar5) + 8);
        uVar3 = *(undefined8 *)((long)(cy->_M_value + lVar5) + 8);
        *(undefined8 *)(cx->_M_value + lVar5) = *(undefined8 *)(cy->_M_value + lVar5);
        *(undefined8 *)((long)(cx->_M_value + lVar5) + 8) = uVar3;
        *(undefined8 *)(cy->_M_value + lVar5) = uVar1;
        *(undefined8 *)((long)(cy->_M_value + lVar5) + 8) = uVar2;
      }
    }
    else {
      pcVar4 = cy + (incy >> 0x1f & (1 - n) * incy);
      pcVar6 = cx + (incx >> 0x1f & (1 - n) * incx);
      while (bVar7 = n != 0, n = n + -1, bVar7) {
        uVar1 = *(undefined8 *)pcVar6->_M_value;
        uVar2 = *(undefined8 *)(pcVar6->_M_value + 8);
        uVar3 = *(undefined8 *)(pcVar4->_M_value + 8);
        *(undefined8 *)pcVar6->_M_value = *(undefined8 *)pcVar4->_M_value;
        *(undefined8 *)(pcVar6->_M_value + 8) = uVar3;
        *(undefined8 *)pcVar4->_M_value = uVar1;
        *(undefined8 *)(pcVar4->_M_value + 8) = uVar2;
        pcVar4 = pcVar4 + incy;
        pcVar6 = pcVar6 + incx;
      }
    }
  }
  return;
}

Assistant:

void zswap ( int n, complex <double> cx[], int incx, complex <double> cy[],
  int incy )

//****************************************************************************80
//
//  Purpose:
//
//    ZSWAP interchanges two complex <double> vectors.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input/output, complex <double> CX[], one of the vectors to swap.
//
//    Input, int INCX, the increment between successive entries of CX.
//
//    Input/output, complex <double> CY[], one of the vectors to swap.
//
//    Input, int INCY, the increment between successive elements of CY.
//
{
  complex <double> ctemp;
  int i;
  int ix;
  int iy;

  if ( n <= 0 )
  {
    return;
  }

  if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      ctemp = cx[i];
      cx[i] = cy[i];
      cy[i] = ctemp;
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      ctemp = cx[ix];
      cx[ix] = cy[iy];
      cy[iy] = ctemp;
      ix = ix + incx;
      iy = iy + incy;
    }
  }

  return;
}